

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory(DynamicMessageFactory *this)

{
  _Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_00;
  allocator_type local_26;
  equal_to<const_google::protobuf::Descriptor_*> local_25;
  hash<const_google::protobuf::Descriptor_*> local_24;
  _Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>
  local_23;
  _Default_ranged_hash local_22;
  _Mod_range_hashing local_21;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_00295c00;
  this->pool_ = (DescriptorPool *)0x0;
  this->delegate_to_generated_factory_ = false;
  this_00 = (_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             *)operator_new(0x30);
  std::tr1::
  _Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::_Hashtable(this_00,10,&local_24,&local_21,&local_22,&local_25,&local_23,&local_26);
  (this->prototypes_).ptr_ = (PrototypeMap *)this_00;
  internal::Mutex::Mutex(&this->prototypes_mutex_);
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory()
  : pool_(NULL), delegate_to_generated_factory_(false),
    prototypes_(new PrototypeMap) {
}